

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_memory.c
# Opt level: O0

void setPagesRX(void *ptr,size_t bytes)

{
  size_t in_RSI;
  void *in_RDI;
  char *errfunc;
  int in_stack_ffffffffffffffec;
  
  pageProtect(in_RDI,in_RSI,in_stack_ffffffffffffffec,(char **)0x13fee5);
  return;
}

Assistant:

void setPagesRX(void* ptr, size_t bytes) {
	char *errfunc;
#if defined(USE_PTHREAD_JIT_WP) && defined(MAC_OS_VERSION_11_0) \
	&& MAC_OS_X_VERSION_MAX_ALLOWED >= MAC_OS_VERSION_11_0
	if (__builtin_available(macOS 11.0, *)) {
		pthread_jit_write_protect_np(1);
		__builtin___clear_cache((char*)ptr, ((char*)ptr) + bytes);
	} else {
		pageProtect(ptr, bytes, PAGE_EXECUTE_READ, &errfunc);
	}
#else
	pageProtect(ptr, bytes, PAGE_EXECUTE_READ, &errfunc);
#endif
}